

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStream
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "int value;\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\nif ($type$_IsValid(value)) {\n  add_$name$(static_cast< $type$ >(value));\n"
                    );
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x20) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,&this->variables_,
                       "} else {\n  mutable_unknown_fields()->AddVarint($number$, value);\n");
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  // Don't use ReadRepeatedPrimitive here so that the enum can be validated.
  printer->Print(variables_,
    "int value;\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
    "       input, &value)));\n"
    "if ($type$_IsValid(value)) {\n"
    "  add_$name$(static_cast< $type$ >(value));\n");
  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(variables_,
      "} else {\n"
      "  mutable_unknown_fields()->AddVarint($number$, value);\n");
  }
  printer->Print("}\n");
}